

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O3

void Amap_ManMatchNode(Amap_Man_t *p,Amap_Obj_t *pNode,int fFlow,int fRefs)

{
  size_t __n;
  byte bVar1;
  ushort uVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  int iVar6;
  Amap_Cut_t AVar7;
  ulong uVar8;
  Amap_Cut_t *pAVar9;
  Amap_Cut_t **ppAVar10;
  ulong uVar11;
  Amap_Set_t *pAVar12;
  Amap_Cut_t *pAVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  Amap_Mat_t local_98;
  Amap_Cut_t *local_78;
  Amap_Set_t *pAStack_70;
  undefined1 auStack_68 [8];
  float fStack_60;
  undefined4 uStack_5c;
  Amap_Cut_t *local_58;
  Amap_Set_t *pAStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined1 auVar22 [16];
  
  pAStack_50 = (Amap_Set_t *)0x0;
  uStack_48 = 0;
  uStack_40 = 0;
  pAStack_70 = (Amap_Set_t *)0x0;
  _auStack_68 = ZEXT816(0);
  if (fRefs == 0) {
    pNode->EstRefs = (float)pNode->nRefs;
  }
  else {
    iVar6 = pNode->nFouts[1] + pNode->nFouts[0];
    pNode->EstRefs = (pNode->EstRefs + pNode->EstRefs + (float)iVar6) / 3.0;
    if (0 < iVar6) {
      Amap_CutAreaDeref(p,&pNode->Best);
    }
  }
  local_78 = (Amap_Cut_t *)0x0;
  local_58 = (Amap_Cut_t *)0x0;
  uVar16 = *(uint *)&pNode->field_0x8;
  if (uVar16 < 0x1000) {
    fVar27 = 0.0;
    fVar26 = 0.0;
    uVar17 = 0;
    fVar19 = 0.0;
    fVar18 = 0.0;
  }
  else {
    pAVar13 = (Amap_Cut_t *)(pNode->field_11).pData;
    uVar11 = 0;
    do {
      AVar7 = *pAVar13;
      uVar8 = (ulong)(uint)AVar7;
      if (((uint)AVar7 & 0xffff) != 0) {
        local_38 = uVar11;
        pAVar12 = p->pLib->pNodes[uVar8 & 0xffff].pSets;
        uVar11 = local_38;
        if (pAVar12 != (Amap_Set_t *)0x0) {
          do {
            local_98.Area = 0.0;
            local_98.AveFan = 0.0;
            local_98.Delay = 0.0;
            local_98._28_4_ = 0;
            uVar2 = *(ushort *)&pAVar12->field_0x8;
            pVVar3 = p->pLib->vGates;
            local_98.pCut = pAVar13;
            local_98.pSet = pAVar12;
            if (fFlow == 0) {
              if (pVVar3->nSize <= (int)(uint)uVar2) goto LAB_003b0d19;
              uVar16 = (uint)(uVar8 >> 0x11);
              if (*(byte *)((long)pVVar3->pArray[uVar2] + 0x3b) != uVar16) {
                __assert_fail("pGate->nPins == pM->pCut->nFans",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                              ,0x1ad,
                              "void Amap_ManMatchGetExacts(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)"
                             );
              }
              fVar26 = 0.0;
              fVar27 = 1.0;
              if (0x1ffff < (uint)uVar8) {
                fVar27 = 0.0;
                uVar11 = 0;
                do {
                  if ((pAVar12->Ins[uVar11] < '\0') ||
                     (uVar15 = *(uint *)((long)&pAVar13[1].field_0x0 +
                                        (ulong)((byte)pAVar12->Ins[uVar11] & 0xfffffffe) * 2),
                     (int)uVar15 < 0)) goto LAB_003b0cfa;
                  uVar15 = uVar15 >> 1;
                  if (p->vObjs->nSize <= (int)uVar15) goto LAB_003b0d19;
                  pvVar4 = p->vObjs->pArray[uVar15];
                  iVar6 = (int)fVar27;
                  if ((int)fVar27 <= (int)*(float *)((long)pvVar4 + 0x50)) {
                    iVar6 = (int)*(float *)((long)pvVar4 + 0x50);
                  }
                  fVar27 = (float)iVar6;
                  fVar26 = fVar26 + (float)(*(int *)((long)pvVar4 + 0x30) +
                                           *(int *)((long)pvVar4 + 0x2c));
                  uVar11 = uVar11 + 1;
                } while (uVar8 >> 0x11 != uVar11);
                fVar27 = fVar27 + 1.0;
              }
              fVar26 = fVar26 / (float)uVar16;
              local_98.AveFan = fVar26;
              local_98.Delay = fVar27;
              fVar19 = Amap_CutAreaRef(p,&local_98);
              fVar18 = Amap_CutAreaDeref(p,&local_98);
              if (fVar18 <= fVar19 - p->fEpsilonInternal) {
                __assert_fail("aResult > aResult2 - p->fEpsilonInternal",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                              ,0x14f,
                              "float Amap_CutAreaDerefed(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)")
                ;
              }
              if (fVar19 + p->fEpsilonInternal <= fVar18) {
                __assert_fail("aResult < aResult2 + p->fEpsilonInternal",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                              ,0x150,
                              "float Amap_CutAreaDerefed(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)")
                ;
              }
              uVar8 = (ulong)(uint)*pAVar13;
              uVar16 = (*(uint *)&pAVar12->field_0x8 ^ (uint)*pAVar13) >> 0x10 & 1;
              local_98.Area = fVar18;
              if ((pNode->nFouts[uVar16] == 0) && (0 < pNode->nFouts[uVar16 ^ 1])) {
                local_98.Area = fVar18 + p->fAreaInv;
              }
            }
            else {
              if (pVVar3->nSize <= (int)(uint)uVar2) {
LAB_003b0d19:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              bVar1 = *(byte *)((long)pVVar3->pArray[uVar2] + 0x3b);
              if ((uint)bVar1 != (uint)(uVar8 >> 0x11)) {
                __assert_fail("pGate->nPins == pM->pCut->nFans",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                              ,0x188,"void Amap_ManMatchGetFlows(Amap_Man_t *, Amap_Mat_t *)");
              }
              local_98.Area = (float)*(double *)((long)pVVar3->pArray[uVar2] + 0x20);
              fVar26 = 0.0;
              fVar19 = local_98.Area;
              if ((uint)uVar8 < 0x20000) {
                fVar27 = 1.0;
              }
              else {
                fVar27 = 0.0;
                uVar11 = 0;
                do {
                  if ((pAVar12->Ins[uVar11] < '\0') ||
                     (uVar16 = *(uint *)((long)&pAVar13[1].field_0x0 +
                                        (ulong)((byte)pAVar12->Ins[uVar11] & 0xfffffffe) * 2),
                     (int)uVar16 < 0)) {
LAB_003b0cfa:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                  ,0x10c,"int Abc_Lit2Var(int)");
                  }
                  uVar16 = uVar16 >> 1;
                  if (p->vObjs->nSize <= (int)uVar16) goto LAB_003b0d19;
                  pvVar4 = p->vObjs->pArray[uVar16];
                  iVar6 = (int)*(float *)((long)pvVar4 + 0x50);
                  if ((int)*(float *)((long)pvVar4 + 0x50) < (int)fVar27) {
                    iVar6 = (int)fVar27;
                  }
                  fVar18 = *(float *)((long)pvVar4 + 0x48);
                  iVar14 = *(int *)((long)pvVar4 + 0x30) + *(int *)((long)pvVar4 + 0x2c);
                  if (iVar14 != 0) {
                    fVar18 = fVar18 / *(float *)((long)pvVar4 + 0x28);
                  }
                  fVar27 = (float)iVar6;
                  fVar19 = fVar19 + fVar18;
                  fVar26 = fVar26 + (float)iVar14;
                  uVar11 = uVar11 + 1;
                } while (bVar1 != uVar11);
                fVar27 = fVar27 + 1.0;
              }
              fVar26 = fVar26 / (float)bVar1;
              local_98.Area = fVar19;
              local_98.AveFan = fVar26;
              local_98.Delay = fVar27;
            }
            AVar7 = SUB84(uVar8,0);
            if (local_78 == (Amap_Cut_t *)0x0) {
LAB_003b0afb:
              auStack_68._4_4_ = local_98.AveFan;
              auStack_68._0_4_ = local_98.Area;
              fStack_60 = local_98.Delay;
              uStack_5c = local_98._28_4_;
              local_78 = local_98.pCut;
              pAStack_70 = local_98.pSet;
            }
            else {
              fVar19 = p->pPars->fEpsilon;
              if ((fVar27 - fVar19 <= fStack_60) &&
                 ((fVar19 + fVar27 < fStack_60 ||
                  ((local_98.Area - fVar19 <= (float)auStack_68._0_4_ &&
                   ((fVar19 + local_98.Area < (float)auStack_68._0_4_ ||
                    ((float)auStack_68._4_4_ <= fVar26 - fVar19)))))))) goto LAB_003b0afb;
            }
            if (local_58 == (Amap_Cut_t *)0x0) {
LAB_003b0b3a:
              uStack_48 = CONCAT44(local_98.AveFan,local_98.Area);
              uStack_40 = CONCAT44(local_98._28_4_,local_98.Delay);
              local_58 = local_98.pCut;
              pAStack_50 = local_98.pSet;
            }
            else {
              fVar19 = p->pPars->fEpsilon;
              if ((local_98.Area - fVar19 <= (float)uStack_48) &&
                 ((local_98.Area + fVar19 < (float)uStack_48 ||
                  ((uStack_48._4_4_ <= fVar26 - fVar19 &&
                   ((uStack_48._4_4_ < fVar26 + fVar19 || (fVar27 - fVar19 <= (float)uStack_40))))))
                 )) goto LAB_003b0b3a;
            }
            pAVar12 = pAVar12->pNext;
          } while (pAVar12 != (Amap_Set_t *)0x0);
          uVar16 = *(uint *)&pNode->field_0x8;
          uVar11 = local_38;
        }
      }
      uVar15 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar15;
      pAVar13 = pAVar13 + (ulong)((uint)AVar7 >> 0x11) + 1;
    } while (uVar15 < uVar16 >> 0xc);
    fVar27 = (float)auStack_68._0_4_;
    fVar26 = (float)uStack_40;
    uVar17 = uStack_5c;
    fVar19 = (float)uStack_48;
    fVar18 = fStack_60;
  }
  fVar19 = fVar19 - fVar27;
  fVar25 = fVar26 - fVar18;
  auVar23._0_8_ = CONCAT44(0x80000000,-fVar19);
  auVar23._8_4_ = 0x80000000;
  auVar23._12_4_ = 0x80000000;
  fVar24 = -fVar25;
  if (-fVar25 <= fVar25) {
    fVar24 = fVar25;
  }
  if (-fVar19 <= fVar19) {
    auVar20._4_12_ = auVar23._4_12_;
    auVar20._0_4_ = fVar19;
    auVar23._0_8_ = auVar20._0_8_;
  }
  auVar22._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
  auVar22._0_8_ = auVar23._0_8_;
  auVar22._12_4_ = -fVar26;
  auVar21._8_8_ = auVar22._8_8_;
  auVar21._0_4_ = (undefined4)auVar23._0_8_;
  auVar21._4_4_ = fVar24 * p->pPars->fADratio;
  auVar5._4_4_ = fVar26;
  auVar5._0_4_ = fVar27;
  auVar5._8_4_ = fVar18;
  auVar5._12_4_ = uVar17;
  auVar23 = divps(auVar21,auVar5);
  ppAVar10 = &local_58;
  if (auVar23._0_4_ < auVar23._4_4_) {
    ppAVar10 = &local_78;
  }
  *(ulong *)pNode =
       *(ulong *)pNode & 0x7fffffffffffffff |
       (ulong)(((uint)ppAVar10[1][2] ^ (uint)**ppAVar10) >> 0x10) << 0x3f;
  pAVar12 = (Amap_Set_t *)ppAVar10[1];
  pAVar13 = ppAVar10[2];
  pAVar9 = ppAVar10[3];
  (pNode->Best).pCut = *ppAVar10;
  (pNode->Best).pSet = pAVar12;
  *(Amap_Cut_t **)&(pNode->Best).Area = pAVar13;
  *(Amap_Cut_t **)&(pNode->Best).Delay = pAVar9;
  pAVar13 = (pNode->Best).pCut;
  __n = (ulong)((uint)*pAVar13 >> 0x11) * 4 + 4;
  pAVar9 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCutBest,(int)__n);
  memcpy(pAVar9,pAVar13,__n);
  (pNode->Best).pCut = pAVar9;
  if ((fRefs != 0) &&
     (iVar6 = pNode->nFouts[1] + pNode->nFouts[0],
     iVar6 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar6 < 0)) {
    Amap_CutAreaRef(p,&pNode->Best);
    return;
  }
  return;
}

Assistant:

void Amap_ManMatchNode( Amap_Man_t * p, Amap_Obj_t * pNode, int fFlow, int fRefs )
{
    int fVerbose = 0; //(pNode->Level == 2 || pNode->Level == 4);
    int fVeryVerbose = fVerbose;

    Amap_Mat_t MA = {0}, MD = {0}, M = {0};
    Amap_Mat_t * pMBestA = &MA, * pMBestD = &MD, * pMThis = &M, * pMBest;
    Amap_Cut_t * pCut;
    Amap_Set_t * pSet;
    Amap_Nod_t * pNod;
    int i;

    if ( fRefs )
        pNode->EstRefs = (float)((2.0 * pNode->EstRefs + Amap_ObjRefsTotal(pNode)) / 3.0);
    else
        pNode->EstRefs = (float)pNode->nRefs;
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaDeref( p, &pNode->Best );

    if ( fVerbose )
        printf( "\nNode %d (%d)\n", pNode->Id, pNode->Level );

    pMBestA->pCut = pMBestD->pCut = NULL;
    Amap_NodeForEachCut( pNode, pCut, i )
    {
        if ( pCut->iMat == 0 )
            continue;
        pNod = Amap_LibNod( p->pLib, pCut->iMat );
        Amap_LibNodeForEachSet( pNod, pSet )
        {
            Amap_ManMatchStart( pMThis, pCut, pSet );
            if ( fFlow )
                Amap_ManMatchGetFlows( p, pMThis );
            else
                Amap_ManMatchGetExacts( p, pNode, pMThis );
            if ( pMBestD->pCut == NULL || Amap_CutCompareDelay(p, pMBestD, pMThis) == 1 )
                *pMBestD = *pMThis;
            if ( pMBestA->pCut == NULL || Amap_CutCompareArea(p, pMBestA, pMThis) == 1 )
                *pMBestA = *pMThis;

            if ( fVeryVerbose ) 
            {
                printf( "Cut %2d (%d) :  ", i, pCut->nFans );
                printf( "Gate %10s  ",      Amap_LibGate(p->pLib, pMThis->pSet->iGate)->pName );
                printf( "%s  ",             pMThis->pSet->fInv ? "inv" : "   " );
                printf( "Delay %5.2f  ",    pMThis->Delay );
                printf( "Area %5.2f  ",     pMThis->Area );
                printf( "\n" );
            }
        }
    }

    if ( Abc_AbsFloat(pMBestA->Area - pMBestD->Area) / pMBestD->Area >= p->pPars->fADratio * Abc_AbsFloat(pMBestA->Delay - pMBestD->Delay) / pMBestA->Delay )
        pMBest = pMBestA;
    else
        pMBest = pMBestD;

    if ( fVerbose )
    {
        printf( "BEST MATCHA:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestA->pSet->iGate)->pName );
        printf( "%s  ",           pMBestA->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestA->Delay );
        printf( "Area %5.2f  ",   pMBestA->Area );
        printf( "\n" ); 

        printf( "BEST MATCHD:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestD->pSet->iGate)->pName );
        printf( "%s  ",           pMBestD->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestD->Delay );
        printf( "Area %5.2f  ",   pMBestD->Area );
        printf( "\n" ); 

        printf( "BEST MATCH :  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBest->pSet->iGate)->pName );
        printf( "%s  ",           pMBest->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBest->Delay );
        printf( "Area %5.2f  ",   pMBest->Area );
        printf( "\n" ); 
    }

    pNode->fPolar = pMBest->pCut->fInv ^ pMBest->pSet->fInv;
    pNode->Best = *pMBest;
    pNode->Best.pCut = Amap_ManDupCut( p, pNode->Best.pCut );
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaRef( p, &pNode->Best );
}